

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
r_code::list<core::P<r_exec::_Fact>_>::push_back_new_cell
          (list<core::P<r_exec::_Fact>_> *this,P<r_exec::_Fact> *t)

{
  size_type sVar1;
  undefined1 local_30 [8];
  cell c;
  P<r_exec::_Fact> *t_local;
  list<core::P<r_exec::_Fact>_> *this_local;
  
  c.data.object = (_Object *)t;
  cell::cell((cell *)local_30);
  core::P<r_exec::_Fact>::operator=((P<r_exec::_Fact> *)&c.prev,(P<r_exec::_Fact> *)c.data.object);
  local_30 = (undefined1  [8])0xffffffffffffffff;
  c.next = this->used_cells_tail;
  std::
  vector<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
  ::push_back(&this->cells,(value_type *)local_30);
  sVar1 = std::
          vector<r_code::list<core::P<r_exec::_Fact>_>::cell,_std::allocator<r_code::list<core::P<r_exec::_Fact>_>::cell>_>
          ::size(&this->cells);
  this->used_cells_tail = sVar1 - 1;
  cell::~cell((cell *)local_30);
  return;
}

Assistant:

void push_back_new_cell(const T &t)
    {
        cell c;
        c.data = t;
        c.next = null;
        c.prev = used_cells_tail;
        cells.push_back(c);
        used_cells_tail = cells.size() - 1;
    }